

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O0

FT_Error ft_bitmap_assure_buffer(FT_Memory memory,FT_Bitmap *bitmap,FT_UInt xpixels,FT_UInt ypixels)

{
  uint uVar1;
  uchar *puVar2;
  uint uVar3;
  uchar *__s;
  uint local_c0;
  uint delta_1;
  uchar *limit_1;
  uchar *out_1;
  uchar *in_1;
  FT_UInt len_1;
  uint delta;
  uchar *limit;
  uchar *out;
  uchar *in;
  uchar *puStack_78;
  FT_UInt len;
  FT_Byte *write;
  FT_UInt count;
  FT_UInt mask;
  FT_UInt shift;
  FT_Byte *end;
  FT_Byte *line;
  FT_UInt bit_last;
  FT_UInt bit_width;
  uchar *buffer;
  FT_UInt height;
  FT_UInt width;
  FT_UInt bpp;
  uint new_pitch;
  uint pitch;
  FT_Error error;
  FT_UInt ypixels_local;
  FT_UInt xpixels_local;
  FT_Bitmap *bitmap_local;
  FT_Memory memory_local;
  
  uVar3 = bitmap->width;
  write._4_4_ = bitmap->rows;
  if (bitmap->pitch < 0) {
    local_c0 = -bitmap->pitch;
  }
  else {
    local_c0 = bitmap->pitch;
  }
  switch(bitmap->pixel_mode) {
  case '\x01':
    height = 1;
    width = uVar3 + xpixels + 7 >> 3;
    break;
  case '\x02':
  case '\x05':
  case '\x06':
    height = 8;
    width = uVar3 + xpixels;
    break;
  case '\x03':
    height = 2;
    width = uVar3 + xpixels + 3 >> 2;
    break;
  case '\x04':
    height = 4;
    width = uVar3 + xpixels + 1 >> 1;
    break;
  default:
    return 0x12;
  }
  error = xpixels;
  _ypixels_local = bitmap;
  bitmap_local = (FT_Bitmap *)memory;
  if ((ypixels == 0) && (width <= local_c0)) {
    uVar3 = (uVar3 + xpixels) * height;
    if (uVar3 < local_c0 << 3) {
      end = bitmap->buffer + (uVar3 >> 3);
      _mask = bitmap->buffer + local_c0;
      pitch = 0;
      for (; write._4_4_ != 0; write._4_4_ = write._4_4_ - 1) {
        puStack_78 = end;
        if ((uVar3 & 7) != 0) {
          *end = *end & (byte)(0xff00 >> (sbyte)(uVar3 & 7));
          puStack_78 = end + 1;
        }
        if (puStack_78 < _mask) {
          memset(puStack_78,0,(long)_mask - (long)puStack_78);
        }
        end = end + local_c0;
        _mask = _mask + local_c0;
      }
    }
    memory_local._4_4_ = 0;
  }
  else {
    pitch = ypixels;
    __s = (uchar *)ft_mem_qrealloc(memory,(ulong)width,0,(ulong)(bitmap->rows + ypixels),(void *)0x0
                                   ,(FT_Error *)&new_pitch);
    if (new_pitch == 0) {
      if (_ypixels_local->pitch < 1) {
        out_1 = _ypixels_local->buffer;
        puVar2 = _ypixels_local->buffer;
        uVar1 = _ypixels_local->rows;
        limit_1 = __s;
        while (out_1 < puVar2 + local_c0 * uVar1) {
          memcpy(limit_1,out_1,(ulong)(uVar3 * height + 7 >> 3));
          out_1 = out_1 + local_c0;
          memset(limit_1 + local_c0,0,(ulong)(width - local_c0));
          limit_1 = limit_1 + local_c0 + (width - local_c0);
        }
        memset(limit_1,0,(ulong)(width * pitch));
      }
      else {
        out = _ypixels_local->buffer;
        puVar2 = _ypixels_local->buffer;
        uVar1 = _ypixels_local->rows;
        memset(__s,0,(ulong)(width * pitch));
        limit = __s + width * pitch;
        while (out < puVar2 + local_c0 * uVar1) {
          memcpy(limit,out,(ulong)(uVar3 * height + 7 >> 3));
          out = out + local_c0;
          memset(limit + local_c0,0,(ulong)(width - local_c0));
          limit = limit + local_c0 + (width - local_c0);
        }
      }
      ft_mem_free((FT_Memory)bitmap_local,_ypixels_local->buffer);
      _ypixels_local->buffer = (uchar *)0x0;
      _ypixels_local->buffer = __s;
      if (_ypixels_local->pitch < 0) {
        _ypixels_local->pitch = -width;
      }
      else {
        _ypixels_local->pitch = width;
      }
      memory_local._4_4_ = 0;
    }
    else {
      memory_local._4_4_ = new_pitch;
    }
  }
  return memory_local._4_4_;
}

Assistant:

static FT_Error
  ft_bitmap_assure_buffer( FT_Memory   memory,
                           FT_Bitmap*  bitmap,
                           FT_UInt     xpixels,
                           FT_UInt     ypixels )
  {
    FT_Error        error;
    unsigned int    pitch;
    unsigned int    new_pitch;
    FT_UInt         bpp;
    FT_UInt         width, height;
    unsigned char*  buffer = NULL;


    width  = bitmap->width;
    height = bitmap->rows;
    pitch  = (unsigned int)FT_ABS( bitmap->pitch );

    switch ( bitmap->pixel_mode )
    {
    case FT_PIXEL_MODE_MONO:
      bpp       = 1;
      new_pitch = ( width + xpixels + 7 ) >> 3;
      break;
    case FT_PIXEL_MODE_GRAY2:
      bpp       = 2;
      new_pitch = ( width + xpixels + 3 ) >> 2;
      break;
    case FT_PIXEL_MODE_GRAY4:
      bpp       = 4;
      new_pitch = ( width + xpixels + 1 ) >> 1;
      break;
    case FT_PIXEL_MODE_GRAY:
    case FT_PIXEL_MODE_LCD:
    case FT_PIXEL_MODE_LCD_V:
      bpp       = 8;
      new_pitch = width + xpixels;
      break;
    default:
      return FT_THROW( Invalid_Glyph_Format );
    }

    /* if no need to allocate memory */
    if ( ypixels == 0 && new_pitch <= pitch )
    {
      /* zero the padding */
      FT_UInt  bit_width = pitch * 8;
      FT_UInt  bit_last  = ( width + xpixels ) * bpp;


      if ( bit_last < bit_width )
      {
        FT_Byte*  line  = bitmap->buffer + ( bit_last >> 3 );
        FT_Byte*  end   = bitmap->buffer + pitch;
        FT_UInt   shift = bit_last & 7;
        FT_UInt   mask  = 0xFF00U >> shift;
        FT_UInt   count = height;


        for ( ; count > 0; count--, line += pitch, end += pitch )
        {
          FT_Byte*  write = line;


          if ( shift > 0 )
          {
            write[0] = (FT_Byte)( write[0] & mask );
            write++;
          }
          if ( write < end )
            FT_MEM_ZERO( write, end - write );
        }
      }

      return FT_Err_Ok;
    }

    /* otherwise allocate new buffer */
    if ( FT_QALLOC_MULT( buffer, bitmap->rows + ypixels, new_pitch ) )
      return error;

    /* new rows get added at the top of the bitmap, */
    /* thus take care of the flow direction         */
    if ( bitmap->pitch > 0 )
    {
      FT_UInt  len = ( width * bpp + 7 ) >> 3;

      unsigned char*  in  = bitmap->buffer;
      unsigned char*  out = buffer;

      unsigned char*  limit = bitmap->buffer + pitch * bitmap->rows;
      unsigned int    delta = new_pitch - pitch;


      FT_MEM_ZERO( out, new_pitch * ypixels );
      out += new_pitch * ypixels;

      while ( in < limit )
      {
        FT_MEM_COPY( out, in, len );
        in  += pitch;
        out += pitch;

        FT_MEM_ZERO( out, delta );
        out += delta;
      }
    }
    else
    {
      FT_UInt  len = ( width * bpp + 7 ) >> 3;

      unsigned char*  in  = bitmap->buffer;
      unsigned char*  out = buffer;

      unsigned char*  limit = bitmap->buffer + pitch * bitmap->rows;
      unsigned int    delta = new_pitch - pitch;


      while ( in < limit )
      {
        FT_MEM_COPY( out, in, len );
        in  += pitch;
        out += pitch;

        FT_MEM_ZERO( out, delta );
        out += delta;
      }

      FT_MEM_ZERO( out, new_pitch * ypixels );
    }

    FT_FREE( bitmap->buffer );
    bitmap->buffer = buffer;

    /* set pitch only, width and height are left untouched */
    if ( bitmap->pitch < 0 )
      bitmap->pitch = -(int)new_pitch;
    else
      bitmap->pitch = (int)new_pitch;

    return FT_Err_Ok;
  }